

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Resize
          (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,map_index_t new_num_buckets)

{
  uint uVar1;
  Arena *this_00;
  KeyNode *node;
  string *psVar2;
  uint uVar3;
  map_index_t b;
  TableEntryPtr *pTVar4;
  MixingHashState MVar5;
  TableEntryPtr *pTVar6;
  pointer __s;
  string *psVar7;
  string *extraout_RAX;
  unsigned_long *puVar8;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  ulong uVar9;
  ViewType k;
  uint64_t s;
  MapAllocator<google::protobuf::internal::TableEntryPtr> aMStack_70 [2];
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pKStack_60;
  unsigned_long local_48 [2];
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  puVar8 = local_48;
  if ((this->super_UntypedMapBase).num_buckets_ == 1) {
    (this->super_UntypedMapBase).index_of_first_non_null_ = 2;
    (this->super_UntypedMapBase).num_buckets_ = 2;
    this_00 = (this->super_UntypedMapBase).alloc_.arena_;
    if (this_00 == (Arena *)0x0) {
      pTVar4 = (TableEntryPtr *)operator_new(0x10);
    }
    else {
      pTVar4 = (TableEntryPtr *)Arena::AllocateForArray(this_00,0x10);
    }
    *pTVar4 = 0;
    pTVar4[1] = 0;
    (this->super_UntypedMapBase).table_ = pTVar4;
    local_48[0] = rdtsc();
    local_38 = this;
    MVar5 = absl::lts_20240722::hash_internal::
            HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
            combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                      ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                       local_48,&(this->super_UntypedMapBase).table_,&local_38);
    (this->super_UntypedMapBase).seed_ = (map_index_t)MVar5.state_;
    return;
  }
  if (new_num_buckets < 2) {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((ulong)new_num_buckets,2,"new_num_buckets >= kMinTableSize");
  }
  else {
    psVar7 = (string *)0x0;
  }
  if (psVar7 != (string *)0x0) {
    KeyMapBase<std::__cxx11::string>::Resize();
    this_01 = (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)aMStack_70;
    uVar3 = (uint)psVar7;
    uVar9 = (ulong)psVar7 & 0xffffffff;
    pKStack_60 = this;
    if (uVar3 < 2) {
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (uVar9,2,"n >= kMinTableSize");
    }
    else {
      psVar7 = (string *)0x0;
    }
    if (psVar7 == (string *)0x0) {
      uVar3 = uVar3 - 1 & uVar3;
      if (uVar3 == 0) {
        psVar7 = (string *)0x0;
      }
      else {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((ulong)uVar3,0,"n & (n - 1) == 0u");
      }
      if (psVar7 == (string *)0x0) {
        aMStack_70[0].arena_ = *(Arena **)((long)puVar8 + 0x18);
        __s = MapAllocator<google::protobuf::internal::TableEntryPtr>::allocate
                        (aMStack_70,uVar9,(void *)0x0);
        memset(__s,0,uVar9 << 3);
        return;
      }
    }
    else {
      UntypedMapBase::CreateEmptyTable();
      psVar7 = extraout_RAX;
    }
    UntypedMapBase::CreateEmptyTable();
    do {
      psVar2 = *(string **)psVar7;
      k._M_str = *(char **)(psVar7 + 8);
      k._M_len = *(size_t *)(psVar7 + 0x10);
      b = BucketNumber(this_01,k);
      InsertUnique(this_01,b,(KeyNode *)psVar7);
      psVar7 = psVar2;
    } while (psVar2 != (string *)0x0);
    return;
  }
  pTVar4 = (this->super_UntypedMapBase).table_;
  uVar3 = (this->super_UntypedMapBase).num_buckets_;
  (this->super_UntypedMapBase).num_buckets_ = new_num_buckets;
  pTVar6 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,new_num_buckets);
  (this->super_UntypedMapBase).table_ = pTVar6;
  uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
  uVar9 = (ulong)uVar1;
  (this->super_UntypedMapBase).index_of_first_non_null_ = (this->super_UntypedMapBase).num_buckets_;
  if (uVar1 < uVar3) {
    do {
      node = (KeyNode *)pTVar4[uVar9];
      if (((ulong)node & 1) == 0 && node != (KeyNode *)0x0) {
        TransferList(this,node);
      }
      else if (((ulong)node & 1) != 0) {
        UntypedMapBase::TransferTree
                  (&this->super_UntypedMapBase,(Tree *)((long)&node[-1].super_NodeBase.next + 7),
                   NodeToVariantKey);
      }
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  UntypedMapBase::DeleteTable(&this->super_UntypedMapBase,pTVar4,uVar3);
  return;
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = kMinTableSize;
      table_ = CreateEmptyTable(num_buckets_);
      seed_ = Seed();
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      if (internal::TableEntryIsNonEmptyList(old_table[i])) {
        TransferList(static_cast<KeyNode*>(TableEntryToNode(old_table[i])));
      } else if (internal::TableEntryIsTree(old_table[i])) {
        this->TransferTree(TableEntryToTree(old_table[i]), NodeToVariantKey);
      }
    }
    DeleteTable(old_table, old_table_size);
  }